

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_loop.c
# Opt level: O0

void loop_undo(jit_State *J,IRRef ins,SnapNo nsnap,MSize nsnapmap)

{
  SnapEntry *pSVar1;
  IRIns *pIVar2;
  SnapShot *pSVar3;
  uint16_t in_CX;
  int in_EDX;
  uint in_ESI;
  jit_State *in_RDI;
  IRIns *ir;
  BPropEntry *bp;
  SnapEntry *map;
  SnapShot *snap;
  ptrdiff_t i;
  long local_20;
  uint local_c;
  
  pSVar3 = (in_RDI->cur).snap + (in_EDX - 1);
  pSVar1 = (in_RDI->cur).snapmap;
  pSVar1[(int)((uint)pSVar3->mapofs + (uint)pSVar3->nent)] = pSVar1[((in_RDI->cur).snap)->nent];
  (in_RDI->cur).nsnapmap = in_CX;
  (in_RDI->cur).nsnap = (uint16_t)in_EDX;
  (in_RDI->guardemit).irt = '\0';
  lj_ir_rollback(in_RDI,in_ESI);
  for (local_20 = 0; local_20 < 0x10; local_20 = local_20 + 1) {
    if (in_ESI <= in_RDI->bpropcache[local_20].val) {
      in_RDI->bpropcache[local_20].key = 0;
    }
  }
  for (local_c = in_ESI - 1; 0x8000 < local_c; local_c = local_c - 1) {
    pIVar2 = (in_RDI->cur).ir;
    (&pIVar2->field_1)[local_c].t.irt = (&pIVar2->field_1)[local_c].t.irt & 0xbf;
    (&pIVar2->field_1)[local_c].t.irt = (&pIVar2->field_1)[local_c].t.irt & 0xdf;
  }
  return;
}

Assistant:

static void loop_undo(jit_State *J, IRRef ins, SnapNo nsnap, MSize nsnapmap)
{
  ptrdiff_t i;
  SnapShot *snap = &J->cur.snap[nsnap-1];
  SnapEntry *map = J->cur.snapmap;
  map[snap->mapofs + snap->nent] = map[J->cur.snap[0].nent];  /* Restore PC. */
  J->cur.nsnapmap = (uint16_t)nsnapmap;
  J->cur.nsnap = nsnap;
  J->guardemit.irt = 0;
  lj_ir_rollback(J, ins);
  for (i = 0; i < BPROP_SLOTS; i++) {  /* Remove backprop. cache entries. */
    BPropEntry *bp = &J->bpropcache[i];
    if (bp->val >= ins)
      bp->key = 0;
  }
  for (ins--; ins >= REF_FIRST; ins--) {  /* Remove flags. */
    IRIns *ir = IR(ins);
    irt_clearphi(ir->t);
    irt_clearmark(ir->t);
  }
}